

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl
          (OptionInterpreter *this,OptionsToInterpret *options_to_interpret,bool skip_extensions)

{
  Message *pMVar1;
  Message *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  undefined1 extraout_AL;
  int iVar3;
  int iVar4;
  FieldDescriptor *pFVar5;
  MessageLite *pMVar6;
  UninterpretedOption *pUVar7;
  Metadata MVar8;
  string_view name;
  string_view name_00;
  string_view data;
  string_view element_name;
  Message *options;
  MessageLite *local_a8;
  string buf;
  vector<int,_std::allocator<int>_> src_path;
  MessageLite **local_40;
  Message **local_38;
  
  pMVar1 = options_to_interpret->options;
  this_00 = options_to_interpret->original_options;
  this->options_to_interpret_ = options_to_interpret;
  options = pMVar1;
  MVar8 = Message::GetMetadata(pMVar1);
  name._M_str = "uninterpreted_option";
  name._M_len = 0x14;
  pFVar5 = Descriptor::FindFieldByName(MVar8.descriptor,name);
  if (pFVar5 == (FieldDescriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&buf,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x249d,"uninterpreted_options_field != nullptr");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&buf,
               (char (*) [60])"No field named \"uninterpreted_option\" in the Options proto.");
LAB_001e2c71:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&buf);
  }
  MVar8 = Message::GetMetadata(pMVar1);
  Reflection::ClearField(MVar8.reflection,pMVar1,pFVar5);
  std::vector<int,_std::allocator<int>_>::vector(&src_path,&options_to_interpret->element_path);
  buf._M_dataplus._M_p._0_4_ = pFVar5->number_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&src_path,(int *)&buf);
  MVar8 = Message::GetMetadata(this_00);
  name_00._M_str = "uninterpreted_option";
  name_00._M_len = 0x14;
  pFVar5 = Descriptor::FindFieldByName(MVar8.descriptor,name_00);
  if (pFVar5 == (FieldDescriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&buf,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x24a8,"original_uninterpreted_options_field != nullptr");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&buf,
               (char (*) [60])"No field named \"uninterpreted_option\" in the Options proto.");
    goto LAB_001e2c71;
  }
  MVar8 = Message::GetMetadata(this_00);
  iVar3 = Reflection::FieldSize(MVar8.reflection,this_00,pFVar5);
  iVar4 = 0;
  while (pMVar1 = options, buf._M_dataplus._M_p._0_4_ = iVar4, iVar4 < iVar3) {
    std::vector<int,_std::allocator<int>_>::push_back(&src_path,(value_type_conflict1 *)&buf);
    MVar8 = Message::GetMetadata(this_00);
    pMVar6 = &Reflection::GetRepeatedMessage
                        (MVar8.reflection,this_00,pFVar5,(int)buf._M_dataplus._M_p)->
              super_MessageLite;
    pUVar7 = DownCastMessage<google::protobuf::UninterpretedOption>(pMVar6);
    this->uninterpreted_option_ = pUVar7;
    bVar2 = InterpretSingleOption
                      (this,options,&src_path,&options_to_interpret->element_path,skip_extensions);
    if (!bVar2) {
      this->options_to_interpret_ = (OptionsToInterpret *)0x0;
      this->uninterpreted_option_ = (UninterpretedOption *)0x0;
      goto LAB_001e2bad;
    }
    src_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = src_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    iVar4 = (int)buf._M_dataplus._M_p + 1;
  }
  this->options_to_interpret_ = (OptionsToInterpret *)0x0;
  this->uninterpreted_option_ = (UninterpretedOption *)0x0;
  pMVar6 = &Message::New(options)->super_MessageLite;
  local_a8 = pMVar6;
  MVar8 = Message::GetMetadata(pMVar1);
  Reflection::Swap(MVar8.reflection,(Message *)pMVar6,pMVar1);
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  bVar2 = MessageLite::AppendToString(local_a8,&buf);
  if (bVar2) {
    data._M_str = buf._M_dataplus._M_p;
    data._M_len = buf._M_string_length;
    bVar2 = MessageLite::ParseFromString(&options->super_MessageLite,data);
    if (bVar2) goto LAB_001e2b86;
  }
  local_40 = &local_a8;
  local_38 = &options;
  make_error.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl(google::protobuf::(anonymous_namespace)::OptionsToInterpret*,bool)::__0,std::__cxx11::string>
  ;
  make_error.ptr_.obj = &local_40;
  element_name._M_str = (options_to_interpret->element_name)._M_dataplus._M_p;
  element_name._M_len = (options_to_interpret->element_name)._M_string_length;
  AddError(this->builder_,element_name,this_00,OTHER,make_error);
  MVar8 = Message::GetMetadata(options);
  Reflection::Swap(MVar8.reflection,(Message *)local_a8,options);
LAB_001e2b86:
  std::__cxx11::string::~string((string *)&buf);
  if (local_a8 != (MessageLite *)0x0) {
    (*local_a8->_vptr_MessageLite[1])();
  }
LAB_001e2bad:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&src_path.super__Vector_base<int,_std::allocator<int>_>);
  return (bool)extraout_AL;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl(
    OptionsToInterpret* options_to_interpret, bool skip_extensions) {
  // Note that these may be in different pools, so we can't use the same
  // descriptor and reflection objects on both.
  Message* options = options_to_interpret->options;
  const Message* original_options = options_to_interpret->original_options;

  bool failed = false;
  options_to_interpret_ = options_to_interpret;

  // Find the uninterpreted_option field in the mutable copy of the options
  // and clear them, since we're about to interpret them.
  const FieldDescriptor* uninterpreted_options_field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  ABSL_CHECK(uninterpreted_options_field != nullptr)
      << "No field named \"uninterpreted_option\" in the Options proto.";
  options->GetReflection()->ClearField(options, uninterpreted_options_field);

  std::vector<int> src_path = options_to_interpret->element_path;
  src_path.push_back(uninterpreted_options_field->number());

  // Find the uninterpreted_option field in the original options.
  const FieldDescriptor* original_uninterpreted_options_field =
      original_options->GetDescriptor()->FindFieldByName(
          "uninterpreted_option");
  ABSL_CHECK(original_uninterpreted_options_field != nullptr)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const int num_uninterpreted_options =
      original_options->GetReflection()->FieldSize(
          *original_options, original_uninterpreted_options_field);
  for (int i = 0; i < num_uninterpreted_options; ++i) {
    src_path.push_back(i);
    uninterpreted_option_ = DownCastMessage<UninterpretedOption>(
        &original_options->GetReflection()->GetRepeatedMessage(
            *original_options, original_uninterpreted_options_field, i));
    if (!InterpretSingleOption(options, src_path,
                               options_to_interpret->element_path,
                               skip_extensions)) {
      // Error already added by InterpretSingleOption().
      failed = true;
      break;
    }
    src_path.pop_back();
  }
  // Reset these, so we don't have any dangling pointers.
  uninterpreted_option_ = nullptr;
  options_to_interpret_ = nullptr;

  if (!failed) {
    // InterpretSingleOption() added the interpreted options in the
    // UnknownFieldSet, in case the option isn't yet known to us.  Now we
    // serialize the options message and deserialize it back.  That way, any
    // option fields that we do happen to know about will get moved from the
    // UnknownFieldSet into the real fields, and thus be available right away.
    // If they are not known, that's OK too. They will get reparsed into the
    // UnknownFieldSet and wait there until the message is parsed by something
    // that does know about the options.

    // Keep the unparsed options around in case the reparsing fails.
    std::unique_ptr<Message> unparsed_options(options->New());
    options->GetReflection()->Swap(unparsed_options.get(), options);

    std::string buf;
    if (!unparsed_options->AppendToString(&buf) ||
        !options->ParseFromString(buf)) {
      builder_->AddError(
          options_to_interpret->element_name, *original_options,
          DescriptorPool::ErrorCollector::OTHER, [&] {
            return absl::StrCat(
                "Some options could not be correctly parsed using the proto "
                "descriptors compiled into this binary.\n"
                "Unparsed options: ",
                unparsed_options->ShortDebugString(),
                "\n"
                "Parsing attempt:  ",
                options->ShortDebugString());
          });
      // Restore the unparsed options.
      options->GetReflection()->Swap(unparsed_options.get(), options);
    }
  }

  return !failed;
}